

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O2

int Bmc_FxCompute(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *pGia;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *p_01;
  long lVar5;
  char *pcVar6;
  int Entry;
  uint Var;
  int (*paiVar7) [2];
  int iVar8;
  long lVar9;
  bool bVar10;
  int nCounter;
  int nCubes [2] [2];
  
  pGia = Gia_ManDupOnsetOffset(p);
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  uVar1 = p->vCos->nSize;
  iVar4 = p->vCis->nSize;
  Entry = p_00->nVars - iVar4;
  iVar3 = sat_solver_nvars(s);
  nCubes[0][0] = 0;
  nCubes[0][1] = 0;
  nCubes[1][0] = 0;
  nCubes[1][1] = 0;
  p_01 = Vec_IntAlloc(iVar4);
  iVar8 = 0;
  if (0 < iVar4) {
    iVar8 = iVar4;
  }
  while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
    Vec_IntPush(p_01,Entry);
    Entry = Entry + 1;
  }
  sat_solver_setnvars(s,iVar3 + uVar1 * 4);
  uVar2 = uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = 0;
  }
  Var = 0;
  do {
    if (Var == uVar2) {
      Vec_IntFree(p_01);
      sat_solver_delete(s);
      Cnf_DataFree(p_00);
      Gia_ManStop(pGia);
      printf("Onset = %5d.   Offset = %5d.      Onset = %5d.   Offset = %5d.\n",
             (ulong)nCubes[0] & 0xffffffff,(ulong)nCubes[0] >> 0x20,(ulong)nCubes[1] & 0xffffffff,
             (ulong)nCubes[1] >> 0x20);
      return 1;
    }
    paiVar7 = nCubes;
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        pcVar6 = "off";
        if (lVar9 == 0) {
          pcVar6 = " on";
        }
        printf("Out %3d %sset ",(ulong)Var,pcVar6);
        iVar4 = Abc_Var2Lit(Var,(int)lVar9);
        iVar8 = Abc_Var2Lit(Var,(int)lVar9);
        iVar4 = Bmc_FxSolve(s,iVar4,iVar8 + uVar1 * 2 * (int)lVar5 + iVar3,p_01,0,0,&nCounter,
                            (Vec_Wec_t *)0x0);
        pcVar6 = "Mismatch";
        if (iVar4 == 0) {
LAB_004997b6:
          puts(pcVar6);
        }
        else if (iVar4 == -1) {
          pcVar6 = "Timeout";
          goto LAB_004997b6;
        }
        (*paiVar7)[lVar9] = (*paiVar7)[lVar9] + nCounter;
      }
      paiVar7 = paiVar7 + 1;
    }
    Var = Var + 1;
  } while( true );
}

Assistant:

int Bmc_FxCompute( Gia_Man_t * p )
{
    // create dual-output circuit with on-set/off-set
    extern Gia_Man_t * Gia_ManDupOnsetOffset( Gia_Man_t * p );
    Gia_Man_t * p2 = Gia_ManDupOnsetOffset( p );
    // create SAT solver
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p2, 8, 0, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    // compute parameters
    int nOuts = Gia_ManCoNum(p);
    int nCiVars = Gia_ManCiNum(p), iCiVarBeg = pCnf->nVars - nCiVars;// - 1;
    int o, i, n, RetValue, nCounter, iAuxVarStart = sat_solver_nvars( pSat );
    int nCubes[2][2] = {{0}};
    // create variables
    Vec_Int_t * vVars = Vec_IntAlloc( nCiVars );
    for ( n = 0; n < nCiVars; n++ )
        Vec_IntPush( vVars, iCiVarBeg + n );
    sat_solver_setnvars( pSat, iAuxVarStart + 4*nOuts );
    // iterate through outputs
    for ( o = 0; o < nOuts; o++ )
    for ( i = 0; i < 2; i++ )
    for ( n = 0; n < 2; n++ ) // 0=onset, 1=offset
//    for ( n = 1; n >= 0; n-- ) // 0=onset, 1=offset
    {
        printf( "Out %3d %sset ", o, n ? "off" : " on" );
        RetValue = Bmc_FxSolve( pSat, Abc_Var2Lit(o, n), iAuxVarStart + 2*i*nOuts + Abc_Var2Lit(o, n), vVars, 0, 0, &nCounter, NULL );
        if ( RetValue == 0 )
            printf( "Mismatch\n" );
        if ( RetValue == -1 )
            printf( "Timeout\n" );
        nCubes[i][n] += nCounter;
    }
    // cleanup
    Vec_IntFree( vVars );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( p2 );
    printf( "Onset = %5d.   Offset = %5d.      Onset = %5d.   Offset = %5d.\n", nCubes[0][0], nCubes[0][1], nCubes[1][0], nCubes[1][1] );
    return 1;
}